

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

bool __thiscall QConfFileSettingsPrivate::isWritable(QConfFileSettingsPrivate *this)

{
  bool bVar1;
  
  if ((((int)(this->super_QSettingsPrivate).format < 2) || (this->writeFunc != (WriteFunc)0x0)) &&
     ((this->confFiles).d.size != 0)) {
    bVar1 = QConfFile::isWritable(*(this->confFiles).d.ptr);
    return bVar1;
  }
  return false;
}

Assistant:

bool QConfFileSettingsPrivate::isWritable() const
{
#if defined(Q_OS_WASM)
    if (format > QSettings::IniFormat && format != QSettings::WebIndexedDBFormat && !writeFunc)
#else
    if (format > QSettings::IniFormat && !writeFunc)
#endif
        return false;

    if (confFiles.isEmpty())
        return false;

    return confFiles.at(0)->isWritable();
}